

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O1

void __thiscall ALsource::~ALsource(ALsource *this)

{
  uint *puVar1;
  int *piVar2;
  __pointer_type pBVar3;
  long lVar4;
  BufferlistItem *ptr;
  long lVar5;
  
  ptr = this->queue;
  while (ptr != (BufferlistItem *)0x0) {
    pBVar3 = (ptr->mNext)._M_b._M_p;
    if (ptr->mBuffer != (BufferStorage *)0x0) {
      LOCK();
      puVar1 = &ptr->mBuffer[1].mSampleRate;
      *puVar1 = *puVar1 - 1;
      UNLOCK();
    }
    al_free(ptr);
    ptr = pBVar3;
  }
  this->queue = (BufferlistItem *)0x0;
  lVar5 = 0;
  do {
    lVar4 = *(long *)((long)&(this->Send)._M_elems[0].Slot + lVar5);
    if (lVar4 != 0) {
      LOCK();
      piVar2 = (int *)(lVar4 + 0x98);
      *piVar2 = *piVar2 + -1;
      UNLOCK();
    }
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0xc0);
  return;
}

Assistant:

ALsource::~ALsource()
{
    BufferlistItem *BufferList{queue};
    while(BufferList != nullptr)
    {
        std::unique_ptr<BufferlistItem> head{BufferList};
        BufferList = head->mNext.load(std::memory_order_relaxed);
        if(BufferStorage *buffer{head->mBuffer})
            DecrementRef(BufferFromStorage(buffer)->ref);
    }
    queue = nullptr;

    auto clear_send = [](ALsource::SendData &send) -> void
    { if(send.Slot) DecrementRef(send.Slot->ref); };
    std::for_each(Send.begin(), Send.end(), clear_send);
}